

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui_sdl.c
# Opt level: O3

int ugui_sdl_get_event(ugui_sdl_t *sdl_ctx)

{
  int iVar1;
  int local_48 [2];
  SDL_Event event;
  
  iVar1 = SDL_PollEvent(local_48);
  if (iVar1 != 0) {
    do {
      if (local_48[0] == 0x300) {
        switch(event.motion.which) {
        case 0x4000004f:
          return 4;
        case 0x40000050:
          return 3;
        case 0x40000051:
          return 2;
        case 0x40000052:
          return 1;
        }
        if (event.motion.which == 0x1b) {
          return 7;
        }
        if (event.motion.which == 0x71) {
          return 7;
        }
      }
      else if (local_48[0] == 0x100) {
        return 7;
      }
      iVar1 = SDL_PollEvent(local_48);
    } while (iVar1 != 0);
  }
  return 0;
}

Assistant:

int ugui_sdl_get_event(ugui_sdl_t* sdl_ctx) {
	//Handle SDL events
	SDL_Event event;
	while (SDL_PollEvent(&event)) {
		if (event.type == SDL_QUIT) {
			return UGUI_EVT_EXIT;
		}
		if (event.type == SDL_KEYDOWN) {
			switch (event.key.keysym.sym) {
			case SDLK_UP:
				return UGUI_EVT_UP;
			case SDLK_DOWN:
				return UGUI_EVT_DOWN;
			case SDLK_LEFT:
				return UGUI_EVT_LEFT;
			case SDLK_RIGHT:
				return UGUI_EVT_RIGHT;
			case SDLK_ESCAPE:
			case SDLK_q:
				return UGUI_EVT_EXIT;
			}
		}
	}
	return UGUI_EVT_NONE;
}